

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Property.hh
# Opt level: O3

size_t __thiscall
OpenMesh::PropertyT<OpenMesh::Attributes::StatusInfo>::store
          (PropertyT<OpenMesh::Attributes::StatusInfo> *this,ostream *_ostr,bool _swap)

{
  undefined8 in_RAX;
  long lVar1;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  size_t sVar5;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  lVar1 = (**(code **)(*(long *)this + 0x58))();
  if (lVar1 == 0) {
    sVar5 = 0;
  }
  else {
    uVar4 = 0;
    sVar5 = 0;
    do {
      uStack_38 = CONCAT44((this->data_).
                           super__Vector_base<OpenMesh::Attributes::StatusInfo,_std::allocator<OpenMesh::Attributes::StatusInfo>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar4].status_,
                           (undefined4)uStack_38);
      sVar2 = IO::binary<unsigned_int>::store(_ostr,(value_type *)((long)&uStack_38 + 4),_swap);
      sVar5 = sVar5 + sVar2;
      uVar4 = uVar4 + 1;
      uVar3 = (**(code **)(*(long *)this + 0x58))(this);
    } while (uVar4 < uVar3);
  }
  return sVar5;
}

Assistant:

virtual size_t store( std::ostream& _ostr, bool _swap ) const
  {
    if ( IO::is_streamable<vector_type>() )
      return IO::store(_ostr, data_, _swap );
    size_t bytes = 0;
    for (size_t i=0; i<n_elements(); ++i)
      bytes += IO::store( _ostr, data_[i], _swap );
    return bytes;
  }